

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::UncommittedDepthStencil
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  Functions *gl_00;
  GLuint *pGVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  ostream *poVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  GLint height;
  GLint width;
  GLint depth;
  string fragmentSource;
  string vertexSource;
  ShaderProgram program;
  ProgramSources sources;
  int local_234;
  int local_230;
  int local_22c;
  Functions *local_228;
  ostream *local_220;
  GLuint *local_218;
  value_type local_210;
  value_type local_1f0;
  ShaderProgram local_1d0;
  ProgramSources local_100;
  
  bVar3 = true;
  if (format == 0x8058 && target == 0xde1) {
    local_220 = (ostream *)
                &(this->super_SparseTexture2CommitmentTestCase).
                 super_SparseTextureCommitmentTestCase.field_0x88;
    local_228 = gl;
    local_218 = texture;
    std::__ostream_insert<char,std::char_traits<char>>(local_220,"Depth Stencil - ",0x10);
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTexture2CommitmentTestCase).
                       super_SparseTextureCommitmentTestCase.mState,level,&local_230,&local_234,
               &local_22c);
    iVar9 = local_230;
    bVar3 = true;
    if (((2 < local_230 + 1U) && (local_234 != 0)) &&
       ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        minDepth <= local_22c)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,st2_vertex_drawBuffer,(allocator<char> *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,st2_fragment_drawBuffer,(allocator<char> *)&local_1d0);
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_100._193_8_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_100.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      memset(&local_100,0,0xac);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_100.sources,&local_1f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_100.sources + 1,&local_210);
      glu::ShaderProgram::ShaderProgram(&local_1d0,local_228,&local_100);
      iVar9 = iVar9 / 2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_100.transformFeedbackVaryings);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_100.attribLocationBindings);
      lVar8 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&local_100.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar8));
        pGVar1 = local_218;
        poVar6 = local_220;
        gl_00 = local_228;
        lVar8 = lVar8 + -0x18;
      } while (lVar8 != -0x18);
      if (local_1d0.m_program.m_info.linkOk == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_220,"Shader compilation failed (depth_stencil) for target: ",0x36);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,target);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", format: ",10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,format);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", vertex_infoLog: ",0x12);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,((*local_1d0.m_shaders[0].
                                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                   _M_dataplus._M_p,
                            ((*local_1d0.m_shaders[0].
                               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                               _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                            _M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", fragment_infoLog: ",0x14);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,((*local_1d0.m_shaders[1].
                                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                   _M_dataplus._M_p,
                            ((*local_1d0.m_shaders[1].
                               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                               _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                            _M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", vertexSource: ",0x10);
        _Var2._M_p = local_1f0._M_dataplus._M_p;
        if (local_1f0._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
        }
        else {
          sVar7 = strlen(local_1f0._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,_Var2._M_p,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", fragmentSource: ",0x12);
        _Var2._M_p = local_210._M_dataplus._M_p;
        if (local_210._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
        }
        else {
          sVar7 = strlen(local_210._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,_Var2._M_p,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," - ",3);
        bVar3 = false;
      }
      else {
        prepareDepthStencilFramebuffer(this,local_228,local_230,local_234);
        (*gl_00->useProgram)(local_1d0.m_program.m_program);
        (*gl_00->activeTexture)(0x84c0);
        GVar5 = (*gl_00->getError)();
        glu::checkError(GVar5,"glActiveTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x621);
        gl4cts::Texture::Bind(gl_00,*pGVar1,target);
        (*gl_00->uniform1i)(1,0);
        GVar5 = (*gl_00->getError)();
        glu::checkError(GVar5,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x624);
        bVar3 = verifyStencilTest(this,gl_00,&local_1d0,local_230,local_234,iVar9);
        if (bVar3) {
          bVar3 = verifyDepthTest(this,gl_00,&local_1d0,local_230,local_234,iVar9);
        }
        else {
          bVar3 = false;
        }
        bVar4 = glu::ContextInfo::isExtensionSupported
                          (((this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                           m_contextInfo,"GL_EXT_depth_bounds_test");
        if ((bVar3 & bVar4) == 1) {
          bVar3 = verifyDepthBoundsTest(this,gl_00,&local_1d0,local_230,local_234,iVar9);
        }
        else {
          bVar3 = (bool)(bVar3 & !bVar4);
        }
        cleanupDepthStencilFramebuffer(this,gl_00);
      }
      glu::ShaderProgram::~ShaderProgram(&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return bVar3;
}

Assistant:

bool UncommittedRegionsAccessTestCase::UncommittedDepthStencil(const Functions& gl, GLint target, GLint format,
															   GLuint& texture, GLint level)
{
	if (!depthStencilAllowed(target, format))
		return true;

	mLog << "Depth Stencil - ";

	bool result = true;

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLuint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	//Prepare shaders
	std::string vertexSource   = st2_vertex_drawBuffer;
	std::string fragmentSource = st2_fragment_drawBuffer;

	ShaderProgram program(gl, glu::makeVtxFragSources(vertexSource, fragmentSource));
	if (!program.isOk())
	{
		mLog << "Shader compilation failed (depth_stencil) for target: " << target << ", format: " << format
			 << ", vertex_infoLog: " << program.getShaderInfo(SHADERTYPE_VERTEX).infoLog
			 << ", fragment_infoLog: " << program.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog
			 << ", vertexSource: " << vertexSource.c_str() << "\n"
			 << ", fragmentSource: " << fragmentSource.c_str() << " - ";

		return false;
	}

	prepareDepthStencilFramebuffer(gl, width, height);

	gl.useProgram(program.getProgram());

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
	Texture::Bind(gl, texture, target);
	gl.uniform1i(1, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

	// Stencil test
	result = result && verifyStencilTest(gl, program, width, height, widthCommitted);

	// Depth test
	result = result && verifyDepthTest(gl, program, width, height, widthCommitted);

	// Depth bounds test
	if (m_context.getContextInfo().isExtensionSupported("GL_EXT_depth_bounds_test"))
		result = result && verifyDepthBoundsTest(gl, program, width, height, widthCommitted);

	// Resources cleaning
	cleanupDepthStencilFramebuffer(gl);

	return result;
}